

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

ostream * ClipperLib::operator<<(ostream *s,Polygon *p)

{
  size_type sVar1;
  reference p_00;
  ulong local_20;
  size_type i;
  Polygon *p_local;
  ostream *s_local;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size(p);
    if (sVar1 <= local_20) break;
    p_00 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (p,local_20);
    operator<<(s,p_00);
    local_20 = local_20 + 1;
  }
  std::operator<<(s,"\n");
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, Polygon &p)
{
  for (Polygon::size_type i = 0; i < p.size(); i++)
    s << p[i];
  s << "\n";
  return s;
}